

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_exponent<char,fmt::v10::appender>(int exp,appender it)

{
  uint value;
  char local_26;
  char local_25;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  if (exp + 9999U < 19999) {
    if (exp < 0) {
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&local_21)
      ;
      exp = -exp;
    }
    else {
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&local_22)
      ;
    }
    value = exp;
    if (99 < (uint)exp) {
      value = (exp & 0xffffU) % 100;
      to_unsigned<int>((exp & 0xffffU) / 100);
      if (999 < (uint)exp) {
        buffer<char>::push_back
                  ((buffer<char> *)
                   it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                   &local_23);
      }
      buffer<char>::push_back
                ((buffer<char> *)
                 it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&local_24)
      ;
    }
    to_unsigned<int>(value);
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&local_25);
    buffer<char>::push_back
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&local_26);
    return (appender)
           it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/format.h"
              ,0x63d,"exponent out of range");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}